

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O1

Node * __thiscall rw::ColorQuant::findNode(ColorQuant *this,Node *root,uint32 addr,int32 level)

{
  Node *pNVar1;
  bool bVar2;
  
  while( true ) {
    pNVar1 = root;
    bVar2 = level == 0;
    level = level + -1;
    if ((bVar2) || (root = root->children[addr & 0xf], root == (Node *)0x0)) break;
    addr = addr >> 4;
  }
  return pNVar1;
}

Assistant:

ColorQuant::Node*
ColorQuant::findNode(ColorQuant::Node *root, uint32 addr, int32 level)
{
	if(level == 0)
		return root;

	uint32 a = addr & 0xF;
	if(root->children[a] == nil)
		return root;

	return this->findNode(root->children[a], addr>>4, level-1);
}